

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsPresolveStatus __thiscall
Highs::runPresolve(Highs *this,bool force_lp_presolve,bool force_presolve)

{
  __type _Var1;
  bool bVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  EVP_PKEY_CTX *ctx;
  HighsLogOptions *log_options_;
  undefined8 uVar5;
  HighsLp *pHVar6;
  undefined8 in_RCX;
  size_t __nbytes;
  byte in_DL;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  byte in_SIL;
  long in_RDI;
  HighsLogOptions *log_options__00;
  double extraout_XMM0_Qa;
  double dVar7;
  HighsLp *reduced_lp;
  double left_1;
  double time_init;
  double current;
  HighsMipSolver solver;
  HighsPresolveStatus presolve_return_status;
  double left;
  double start_presolve;
  HighsLp *original_lp;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  HighsLp *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  HighsInt in_stack_fffffffffffffc7c;
  HighsTimer *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  HighsMipSolver *in_stack_fffffffffffffc90;
  string local_350 [31];
  undefined1 in_stack_fffffffffffffccf;
  HighsSolution *in_stack_fffffffffffffcd0;
  HighsLp *in_stack_fffffffffffffcd8;
  HighsOptions *in_stack_fffffffffffffce0;
  double dVar8;
  HighsPresolveStatus presolve_status;
  Highs *in_stack_fffffffffffffce8;
  HighsMipSolver *in_stack_fffffffffffffcf0;
  HighsInt in_stack_fffffffffffffd00;
  HighsPresolveStatus local_34;
  HighsPresolveStatus local_4;
  
  __nbytes = CONCAT71((int7)((ulong)in_RCX >> 8),in_SIL) & 0xffffffffffffff01;
  PresolveComponent::clear((PresolveComponent *)0x4885a0);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  HVar4 = (HighsInt)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  if ((_Var1) && ((in_DL & 1) == 0)) {
    local_4 = kNotPresolved;
  }
  else {
    bVar2 = HighsModel::isEmpty((HighsModel *)(in_RDI + 0x138));
    if (bVar2) {
      local_4 = kNotReduced;
    }
    else {
      ctx = (EVP_PKEY_CTX *)(in_RDI + 0x138);
      HighsLp::ensureColwise((HighsLp *)0x488623);
      if ((*(int *)ctx == 0) && (*(int *)(in_RDI + 0x13c) == 0)) {
        local_4 = kNullError;
      }
      else {
        bVar2 = HighsTimer::running(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        __buf = extraout_RDX;
        if (!bVar2) {
          HighsTimer::start(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          __buf = extraout_RDX_00;
        }
        HighsTimer::read((HighsTimer *)(in_RDI + 0x920),0,__buf,__nbytes);
        if ((0.0 < *(double *)(in_RDI + 0xb30)) &&
           (*(double *)(in_RDI + 0xb30) <= INFINITY && *(double *)(in_RDI + 0xb30) != INFINITY)) {
          if (*(double *)(in_RDI + 0xb30) - (double)log_options__00 <= 0.0) {
            highsLogDev((HighsLogOptions *)(in_RDI + 0xe28),kError,
                        "Time limit reached while reading in matrix\n");
            return kTimeout;
          }
          highsLogDev(log_options__00,(HighsLogType)(in_RDI + 0xe28),(char *)0x3,
                      "Time limit set: reading matrix took %.2g, presolve time left: %.2g\n");
        }
        bVar2 = HighsModel::isMip((HighsModel *)0x488780);
        if ((bVar2) && ((in_SIL & 1) == 0)) {
          in_stack_fffffffffffffc68 = 0;
          HighsMipSolver::HighsMipSolver
                    (in_stack_fffffffffffffcf0,(HighsCallback *)in_stack_fffffffffffffce8,
                     in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                     (bool)in_stack_fffffffffffffccf,in_stack_fffffffffffffd00);
          presolve_status = (HighsPresolveStatus)((ulong)in_stack_fffffffffffffce0 >> 0x20);
          HighsTimer::start(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          HighsMipSolver::runPresolve(in_stack_fffffffffffffc90,HVar4);
          local_34 = HighsMipSolver::getPresolveStatus((HighsMipSolver *)0x488814);
          HighsMipSolver::getPresolvedModel((HighsMipSolver *)0x488832);
          HighsLp::operator=(in_stack_fffffffffffffc70,
                             (HighsLp *)
                             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          HighsMipSolver::getPostsolveStack
                    ((HighsMipSolver *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                    );
          ::presolve::HighsPostsolveStack::operator=
                    ((HighsPostsolveStack *)in_stack_fffffffffffffc70,
                     (HighsPostsolveStack *)
                     CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          ::presolve::HighsPostsolveStack::~HighsPostsolveStack
                    ((HighsPostsolveStack *)in_stack_fffffffffffffc70);
          *(HighsPresolveStatus *)(in_RDI + 0x51b8) = local_34;
          HighsMipSolver::~HighsMipSolver((HighsMipSolver *)in_stack_fffffffffffffc70);
        }
        else {
          PresolveComponent::init((PresolveComponent *)(in_RDI + 0x4c08),ctx);
          presolve_status = (HighsPresolveStatus)((ulong)in_stack_fffffffffffffce0 >> 0x20);
          *(size_t *)(in_RDI + 0x51a8) = in_RDI + 0xaa8U;
          if ((0.0 < *(double *)(in_RDI + 0xb30)) &&
             (*(double *)(in_RDI + 0xb30) <= INFINITY && *(double *)(in_RDI + 0xb30) != INFINITY)) {
            HighsTimer::read((HighsTimer *)(in_RDI + 0x920),0,__buf_00,in_RDI + 0xaa8U);
            dVar7 = *(double *)(*(long *)(in_RDI + 0x51a8) + 0x88) -
                    (extraout_XMM0_Qa - (double)log_options__00);
            if (dVar7 <= 0.0) {
              highsLogDev((HighsLogOptions *)(in_RDI + 0xe28),kError,
                          "Time limit reached while copying matrix into presolve.\n");
              return kTimeout;
            }
            dVar8 = extraout_XMM0_Qa;
            highsLogDev((HighsLogOptions *)(extraout_XMM0_Qa - (double)log_options__00),
                        (HighsLogType)dVar7,(char *)(in_RDI + 0xe28),3,
                        "Time limit set: copying matrix took %.2g, presolve time left: %.2g\n");
            presolve_status = (HighsPresolveStatus)((ulong)dVar8 >> 0x20);
          }
          local_34 = PresolveComponent::run((PresolveComponent *)solver.timer_._128_8_);
        }
        log_options_ = (HighsLogOptions *)(in_RDI + 0xe28);
        presolveStatusToString_abi_cxx11_(in_stack_fffffffffffffce8,presolve_status);
        uVar5 = std::__cxx11::string::c_str();
        highsLogDev(log_options_,kVerbose,"presolve_.run() returns status: %s\n",uVar5);
        std::__cxx11::string::~string(local_350);
        PresolveComponent::getPresolveLog((PresolveComponent *)(in_RDI + 0x4c08));
        HighsPresolveLog::operator=
                  ((HighsPresolveLog *)in_stack_fffffffffffffc70,
                   (HighsPresolveLog *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                  );
        if (*(int *)(in_RDI + 0x51b8) == 3) {
          pHVar6 = PresolveComponent::getReducedProblem((PresolveComponent *)(in_RDI + 0x4c08));
          *(int *)(in_RDI + 0x4c28) = *(int *)ctx - pHVar6->num_col_;
          *(int *)(in_RDI + 0x4c24) = *(int *)(in_RDI + 0x13c) - pHVar6->num_row_;
          HVar4 = HighsSparseMatrix::numNz
                            ((HighsSparseMatrix *)
                             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          HVar3 = HighsSparseMatrix::numNz
                            ((HighsSparseMatrix *)
                             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          *(HighsInt *)(in_RDI + 0x4c2c) = HVar4 - HVar3;
          HighsLp::clearScale(in_stack_fffffffffffffc70);
        }
        else if (*(int *)(in_RDI + 0x51b8) == 4) {
          *(undefined4 *)(in_RDI + 0x4c28) = *(undefined4 *)ctx;
          *(undefined4 *)(in_RDI + 0x4c24) = *(undefined4 *)(in_RDI + 0x13c);
          HVar4 = HighsSparseMatrix::numNz
                            ((HighsSparseMatrix *)
                             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          *(HighsInt *)(in_RDI + 0x4c2c) = HVar4;
        }
        bVar2 = HighsModel::isMip((HighsModel *)0x488be3);
        if (!bVar2) {
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::clear
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x488c07);
        }
        local_4 = local_34;
      }
    }
  }
  return local_4;
}

Assistant:

HighsPresolveStatus Highs::runPresolve(const bool force_lp_presolve,
                                       const bool force_presolve) {
  presolve_.clear();
  // Exit if presolve is set to off (unless presolve is forced)
  if (options_.presolve == kHighsOffString && !force_presolve)
    return HighsPresolveStatus::kNotPresolved;

  if (model_.isEmpty()) {
    // Empty models shouldn't reach here, but this status would cause
    // no harm if one did
    assert(1 == 0);
    return HighsPresolveStatus::kNotReduced;
  }

  // Ensure that the LP is column-wise
  HighsLp& original_lp = model_.lp_;
  original_lp.ensureColwise();

  if (original_lp.num_col_ == 0 && original_lp.num_row_ == 0)
    return HighsPresolveStatus::kNullError;

  // Ensure that the timer is running
  if (!timer_.running()) timer_.start();
  double start_presolve = timer_.read();

  // Set time limit.
  if (options_.time_limit > 0 && options_.time_limit < kHighsInf) {
    double left = options_.time_limit - start_presolve;
    if (left <= 0) {
      highsLogDev(options_.log_options, HighsLogType::kError,
                  "Time limit reached while reading in matrix\n");
      return HighsPresolveStatus::kTimeout;
    }

    highsLogDev(options_.log_options, HighsLogType::kVerbose,
                "Time limit set: reading matrix took %.2g, presolve "
                "time left: %.2g\n",
                start_presolve, left);
  }

  // Presolve.
  HighsPresolveStatus presolve_return_status =
      HighsPresolveStatus::kNotPresolved;
  if (model_.isMip() && !force_lp_presolve) {
    // Use presolve for MIP
    //
    // Presolved model is extracted now since it's part of solver,
    // which is lost on return
    HighsMipSolver solver(callback_, options_, original_lp, solution_);
    // Start the MIP solver's timer so that timeout in presolve can be
    // identified
    solver.timer_.start();
    // Only place that HighsMipSolver::runPresolve is called
    solver.runPresolve(options_.presolve_reduction_limit);
    presolve_return_status = solver.getPresolveStatus();
    // Assign values to data members of presolve_
    presolve_.data_.reduced_lp_ = solver.getPresolvedModel();
    presolve_.data_.postSolveStack = solver.getPostsolveStack();
    presolve_.presolve_status_ = presolve_return_status;
    //    presolve_.data_.presolve_log_ =
  } else {
    // Use presolve for LP
    presolve_.init(original_lp, timer_);
    presolve_.options_ = &options_;
    if (options_.time_limit > 0 && options_.time_limit < kHighsInf) {
      double current = timer_.read();
      double time_init = current - start_presolve;
      double left = presolve_.options_->time_limit - time_init;
      if (left <= 0) {
        highsLogDev(options_.log_options, HighsLogType::kError,
                    "Time limit reached while copying matrix into presolve.\n");
        return HighsPresolveStatus::kTimeout;
      }
      highsLogDev(options_.log_options, HighsLogType::kVerbose,
                  "Time limit set: copying matrix took %.2g, presolve "
                  "time left: %.2g\n",
                  time_init, left);
    }

    presolve_return_status = presolve_.run();
  }

  highsLogDev(options_.log_options, HighsLogType::kVerbose,
              "presolve_.run() returns status: %s\n",
              presolveStatusToString(presolve_return_status).c_str());

  // Update reduction counts.
  assert(presolve_return_status == presolve_.presolve_status_);
  presolve_log_ = presolve_.getPresolveLog();
  switch (presolve_.presolve_status_) {
    case HighsPresolveStatus::kReduced: {
      HighsLp& reduced_lp = presolve_.getReducedProblem();
      presolve_.info_.n_cols_removed =
          original_lp.num_col_ - reduced_lp.num_col_;
      presolve_.info_.n_rows_removed =
          original_lp.num_row_ - reduced_lp.num_row_;
      presolve_.info_.n_nnz_removed = (HighsInt)original_lp.a_matrix_.numNz() -
                                      (HighsInt)reduced_lp.a_matrix_.numNz();
      // Clear any scaling information inherited by the reduced LP
      reduced_lp.clearScale();
      assert(lpDimensionsOk("RunPresolve: reduced_lp", reduced_lp,
                            options_.log_options));
      break;
    }
    case HighsPresolveStatus::kReducedToEmpty: {
      presolve_.info_.n_cols_removed = original_lp.num_col_;
      presolve_.info_.n_rows_removed = original_lp.num_row_;
      presolve_.info_.n_nnz_removed = (HighsInt)original_lp.a_matrix_.numNz();
      break;
    }
    default:
      break;
  }
  // Presolve creates integrality vector for an LP, so clear it
  if (!model_.isMip()) presolve_.data_.reduced_lp_.integrality_.clear();

  return presolve_return_status;
}